

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

btScalar gjkepa2_impl::GJK::projectorigin
                   (btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *d,btScalar *w,U *m)

{
  U *in_RSI;
  btScalar *in_RDI;
  float *in_R8;
  undefined4 *in_R9;
  btScalar bVar1;
  btScalar bVar2;
  btVector3 *unaff_retaddr;
  btVector3 *in_stack_00000008;
  btScalar subd;
  btScalar s;
  U j;
  U i;
  U subm;
  btScalar subw [3];
  btScalar mindist;
  bool ng;
  btScalar vl;
  btVector3 dl [3];
  btVector3 *vt [4];
  btVector3 *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  btVector3 *in_stack_fffffffffffffee0;
  btVector3 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff20;
  U in_stack_ffffffffffffff24;
  uint local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  btScalar local_c0 [4];
  btScalar local_b0 [4];
  btScalar local_a0 [4];
  undefined1 local_8d;
  btScalar local_8c;
  btScalar local_88 [4];
  btScalar local_78 [4];
  btScalar local_68 [4];
  undefined4 *local_38;
  float *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_88 = (btScalar  [4])
             operator-(in_stack_fffffffffffffee0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_78 = (btScalar  [4])
             operator-(in_stack_fffffffffffffee0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_68 = (btScalar  [4])
             operator-(in_stack_fffffffffffffee0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bVar1 = det((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff10.m_floats._8_8_,in_stack_ffffffffffffff10.m_floats._0_8_);
  local_8c = bVar1;
  local_b0 = (btScalar  [4])
             operator-(in_stack_fffffffffffffee0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_c0 = (btScalar  [4])
             operator-(in_stack_fffffffffffffee0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_a0 = (btScalar  [4])
             btCross((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
  bVar2 = btDot((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                in_stack_fffffffffffffec8);
  local_8d = bVar1 * bVar2 <= 0.0;
  if ((!(bool)local_8d) || (bVar1 = btFabs(local_8c), bVar1 <= 0.0)) {
    local_c4 = -1.0;
  }
  else {
    local_c4 = -1.0;
    memset(&local_d0,0,0xc);
    for (local_d8 = 0; bVar1 = local_8c, local_d8 < 3; local_d8 = local_d8 + 1) {
      in_stack_ffffffffffffff24 = projectorigin::imd3[local_d8];
      in_stack_ffffffffffffff10 =
           btCross((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
      bVar2 = btDot((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8);
      in_stack_ffffffffffffff20 = bVar1 * bVar2;
      if ((0.0 < in_stack_ffffffffffffff20) &&
         ((bVar1 = projectorigin(in_stack_00000008,unaff_retaddr,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,in_RSI), local_c4 < 0.0 || (bVar1 < local_c4)))) {
        in_stack_fffffffffffffed4 = 0;
        *local_38 = 0;
        local_30[local_d8] = local_d0;
        local_30[in_stack_ffffffffffffff24] = local_cc;
        local_30[projectorigin::imd3[in_stack_ffffffffffffff24]] = 0.0;
        local_30[3] = local_c8;
        local_c4 = bVar1;
      }
    }
    if (local_c4 < 0.0) {
      local_c4 = 0.0;
      *local_38 = 0xf;
      bVar1 = det((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff10.m_floats._8_8_,in_stack_ffffffffffffff10.m_floats._0_8_)
      ;
      *local_30 = bVar1 / local_8c;
      bVar1 = det((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff10.m_floats._8_8_,in_stack_ffffffffffffff10.m_floats._0_8_)
      ;
      local_30[1] = bVar1 / local_8c;
      bVar1 = det((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff10.m_floats._8_8_,in_stack_ffffffffffffff10.m_floats._0_8_)
      ;
      local_30[2] = bVar1 / local_8c;
      local_30[3] = 1.0 - (*local_30 + local_30[1] + local_30[2]);
    }
  }
  return local_c4;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				const btVector3& d,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c,&d};
				const btVector3		dl[]={a-d,b-d,c-d};
				const btScalar		vl=det(dl[0],dl[1],dl[2]);
				const bool			ng=(vl*btDot(a,btCross(b-c,a-b)))<=0;
				if(ng&&(btFabs(vl)>GJK_SIMPLEX4_EPS))
				{
					btScalar	mindist=-1;
					btScalar	subw[3]={0.f,0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						const U			j=imd3[i];
						const btScalar	s=vl*btDot(d,btCross(dl[i],dl[j]));
						if(s>0)
						{
							const btScalar	subd=projectorigin(*vt[i],*vt[j],d,subw,subm);
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>((subm&1?1<<i:0)+
									(subm&2?1<<j:0)+
									(subm&4?8:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;
								w[3]		=	subw[2];
							}
						}
					}
					if(mindist<0)
					{
						mindist	=	0;
						m		=	15;
						w[0]	=	det(c,b,d)/vl;
						w[1]	=	det(a,c,d)/vl;
						w[2]	=	det(b,a,d)/vl;
						w[3]	=	1-(w[0]+w[1]+w[2]);
					}
					return(mindist);
				}
				return(-1);
			}